

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

int __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::copy
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pIVar3;
  size_type sVar4;
  undefined8 uVar5;
  ItemGroup *first;
  long lVar6;
  int local_18 [4];
  
  if (this->len != 0) {
    first = (ItemGroup *)BumpAllocator::allocate((BumpAllocator *)dst,this->len * 0x18,8);
    pIVar3 = this->data_;
    sVar4 = this->len;
    for (lVar6 = 0; sVar4 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
      puVar1 = (undefined8 *)((long)&(pIVar3->expressions).data_ + lVar6);
      puVar2 = (undefined8 *)((long)&(first->expressions).data_ + lVar6);
      puVar2[2] = puVar1[2];
      uVar5 = puVar1[1];
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
    }
    nonstd::span_lite::span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul>::
    span<slang::ast::CaseAssertionExpr::ItemGroup*>
              ((span<slang::ast::CaseAssertionExpr::ItemGroup,18446744073709551615ul> *)local_18,
               first,this->len);
    return local_18[0];
  }
  return 0;
}

Assistant:

[[nodiscard]] span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::uninitialized_copy(begin(), end(), dest);

        return span<T>(dest, len);
    }